

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_ReversePointGrid(int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
                        int point_stride1,double *p,int dir)

{
  bool bVar1;
  int local_28;
  bool local_21;
  int i;
  bool rc;
  int point_stride1_local;
  int point_stride0_local;
  int point_count1_local;
  int point_count0_local;
  bool is_rat_local;
  int dim_local;
  
  local_21 = false;
  if (dir == 0) {
    local_21 = ON_ReversePointGrid(dim,is_rat,point_count1,point_count0,point_stride1,point_stride0,
                                   p,1);
  }
  else {
    for (local_28 = 0; local_28 < point_count0; local_28 = local_28 + 1) {
      bVar1 = ON_ReversePointList(dim,is_rat,point_count1,point_stride1,p + local_28 * point_stride0
                                 );
      if (!bVar1) {
        return false;
      }
      if (local_28 == 0) {
        local_21 = true;
      }
    }
  }
  return local_21;
}

Assistant:

bool 
ON_ReversePointGrid(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        double* p,
        int dir
        )
{
  bool rc = false;
  if ( !dir ) {
    rc = ON_ReversePointGrid( dim, is_rat, point_count1, point_count0, point_stride1, point_stride0, p, 1 );
  }
  else {
    int i;
    for ( i = 0; i < point_count0; i++ ) {
      if ( !ON_ReversePointList( dim, is_rat, point_count1, point_stride1, p + i*point_stride0 ) ) {
        rc = false;
        break;
      }
      else if (!i) {
        rc = true;
      }
    }
  }
  return rc;
}